

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::APITest2::verifyGLGetActiveSubroutineNameFunctionality(APITest2 *this)

{
  int iVar1;
  deUint32 dVar2;
  size_t sVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  GLchar *pGVar8;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  int local_24;
  long lStack_20;
  GLsizei reported_length;
  Functions *gl;
  GLsizei expected_length2;
  GLsizei expected_length1;
  APITest2 *this_local;
  
  _expected_length2 = this;
  sVar3 = strlen(this->m_subroutine_name1);
  gl._4_4_ = (int)sVar3 + 1;
  sVar3 = strlen(this->m_subroutine_name1);
  gl._0_4_ = (int)sVar3 + 1;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  (**(code **)(lStack_20 + 0x738))(this->m_po_id,0x8b31,0,0,0);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glGetActiveSubroutineName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x7de);
  (**(code **)(lStack_20 + 0x990))(this->m_po_id,0x92e8,0x92f6,&local_24);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glGetActiveSubroutineName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x7e1);
  if ((local_24 != gl._4_4_) && (local_24 != (int)gl)) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [48])"Invalid active subroutine name length reported:")
    ;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])", instead of: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&gl + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])" or ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&gl);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Incorrect length of active subroutine name",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x7ea);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pGVar8 = (GLchar *)operator_new__((long)local_24);
  this->m_buffer = pGVar8;
  memset(this->m_buffer,0,(long)local_24);
  (**(code **)(lStack_20 + 0x738))(this->m_po_id,0x8b31,0,local_24,0,this->m_buffer);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glGetActiveSubroutineName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x7f3);
  iVar1 = strcmp(this->m_buffer,this->m_subroutine_name1);
  if (iVar1 != 0) {
    iVar1 = strcmp(this->m_buffer,this->m_subroutine_name2);
    if (iVar1 != 0) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_338,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_338,(char (*) [42])"Invalid active subroutine name reported:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_buffer);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"] instead of:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_subroutine_name1);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])"] or:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_subroutine_name2);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2aea36f);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_338);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid active subroutine name reported.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x7fe);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  if (this->m_buffer != (GLchar *)0x0) {
    operator_delete__(this->m_buffer);
  }
  this->m_buffer = (GLchar *)0x0;
  return;
}

Assistant:

void APITest2::verifyGLGetActiveSubroutineNameFunctionality()
{
	GLsizei				  expected_length1 = (GLsizei)strlen(m_subroutine_name1) + 1;
	GLsizei				  expected_length2 = (GLsizei)strlen(m_subroutine_name1) + 1;
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	GLsizei				  reported_length  = 0;

	gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, 0, /* index */
							   0,							 /* bufsize */
							   DE_NULL,						 /* length */
							   DE_NULL);					 /* name */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineName() call failed.");

	gl.getProgramInterfaceiv(m_po_id, GL_VERTEX_SUBROUTINE, GL_MAX_NAME_LENGTH, &reported_length);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineName() call failed.");

	if ((reported_length != expected_length1) && (reported_length != expected_length2))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid active subroutine name length reported:" << reported_length
						   << ", instead of: " << expected_length1 << " or " << expected_length2
						   << tcu::TestLog::EndMessage;

		TCU_FAIL("Incorrect length of active subroutine name");
	}

	m_buffer = new glw::GLchar[reported_length];

	memset(m_buffer, 0, reported_length);

	gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, 0, reported_length, DE_NULL, /* length */
							   m_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineName() call failed.");

	if (strcmp(m_buffer, m_subroutine_name1) != 0 && strcmp(m_buffer, m_subroutine_name2) != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid active subroutine name reported:[" << m_buffer
						   << "]"
							  " instead of:["
						   << m_subroutine_name1 << "]"
													" or:["
						   << m_subroutine_name2 << "]." << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid active subroutine name reported.");
	}

	delete[] m_buffer;
	m_buffer = DE_NULL;
}